

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockExpectedCallTest.cpp
# Opt level: O3

void __thiscall
TEST_MockExpectedCall_callWithObjectParameterEqualComparisonButFailsWithoutRepository_Test::testBody
          (TEST_MockExpectedCall_callWithObjectParameterEqualComparisonButFailsWithoutRepository_Test
           *this)

{
  MockCheckedExpectedCall *pMVar1;
  int iVar2;
  UtestShell *pUVar3;
  TestTerminator *pTVar4;
  SimpleString local_b0;
  TypeForTestingExpectedFunctionCall equalType;
  TypeForTestingExpectedFunctionCall type;
  SimpleString local_80;
  MockNamedValue parameter;
  
  type._vptr_TypeForTestingExpectedFunctionCall =
       (_func_int **)&PTR__TypeForTestingExpectedFunctionCall_002b85a0;
  type.value = (int *)operator_new(4,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockExpectedCallTest.cpp"
                                   ,0x26);
  *type.value = 1;
  equalType._vptr_TypeForTestingExpectedFunctionCall =
       (_func_int **)&PTR__TypeForTestingExpectedFunctionCall_002b85a0;
  equalType.value =
       (int *)operator_new(4,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockExpectedCallTest.cpp"
                           ,0x26);
  *equalType.value = 1;
  SimpleString::SimpleString(&local_b0,"name");
  MockNamedValue::MockNamedValue(&parameter,&local_b0);
  SimpleString::~SimpleString(&local_b0);
  SimpleString::SimpleString(&local_b0,"type");
  MockNamedValue::setConstObjectPointer(&parameter,&local_b0,&equalType);
  SimpleString::~SimpleString(&local_b0);
  pMVar1 = (this->super_TEST_GROUP_CppUTestGroupMockExpectedCall).call;
  SimpleString::SimpleString(&local_b0,"type");
  SimpleString::SimpleString(&local_80,"name");
  (*(pMVar1->super_MockExpectedCall)._vptr_MockExpectedCall[5])(pMVar1,&local_b0,&local_80,&type);
  SimpleString::~SimpleString(&local_80);
  SimpleString::~SimpleString(&local_b0);
  pUVar3 = UtestShell::getCurrent();
  pMVar1 = (this->super_TEST_GROUP_CppUTestGroupMockExpectedCall).call;
  iVar2 = (*(pMVar1->super_MockExpectedCall)._vptr_MockExpectedCall[0x2b])(pMVar1,&parameter);
  pTVar4 = UtestShell::getCurrentTestTerminator();
  (*pUVar3->_vptr_UtestShell[8])
            (pUVar3,(ulong)(byte)((byte)iVar2 ^ 1),"CHECK","!call->hasInputParameter(parameter)",0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockExpectedCallTest.cpp"
             ,0x167,pTVar4);
  MockNamedValue::~MockNamedValue(&parameter);
  equalType._vptr_TypeForTestingExpectedFunctionCall =
       (_func_int **)&PTR__TypeForTestingExpectedFunctionCall_002b85a0;
  operator_delete(equalType.value,4);
  type._vptr_TypeForTestingExpectedFunctionCall =
       (_func_int **)&PTR__TypeForTestingExpectedFunctionCall_002b85a0;
  operator_delete(type.value,4);
  return;
}

Assistant:

TEST(MockExpectedCall, callWithObjectParameterEqualComparisonButFailsWithoutRepository)
{
    TypeForTestingExpectedFunctionCall type(1), equalType(1);
    MockNamedValue parameter("name");
    parameter.setConstObjectPointer("type", &equalType);
    call->withParameterOfType("type", "name", &type);
    CHECK(!call->hasInputParameter(parameter));
}